

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcLits.c
# Opt level: O3

Mvc_Cover_t * Mvc_CoverBestLiteralCover(Mvc_Cover_t *pCover,Mvc_Cover_t *pSimple)

{
  int *piVar1;
  int iVar2;
  Mvc_Cover_t *pCover_00;
  Mvc_Cube_t *pMVar3;
  Mvc_Cube_t *pMVar4;
  uint uVar5;
  
  pCover_00 = Mvc_CoverClone(pCover);
  pMVar3 = Mvc_CubeAlloc(pCover_00);
  uVar5 = *(uint *)&pMVar3->field_0x8 & 0xffffff;
  if (uVar5 == 0) {
    pMVar3->pData[0] = 0;
  }
  else if (uVar5 == 1) {
    *(undefined8 *)pMVar3->pData = 0;
  }
  else {
    memset(pMVar3->pData,0,(ulong)(*(uint *)&pMVar3->field_0x8 & 0xffffff) * 4 + 4);
  }
  iVar2 = Mvc_CoverReadCubeNum(pSimple);
  if (iVar2 == 1) {
    pMVar4 = Mvc_CoverReadCubeHead(pSimple);
    iVar2 = Mvc_CoverBestLiteral(pCover,pMVar4);
    pMVar3->pData[iVar2 >> 5] = pMVar3->pData[iVar2 >> 5] | 1 << ((byte)iVar2 & 0x1f);
    if ((pCover_00->lCubes).pHead == (Mvc_Cube_t *)0x0) {
      pMVar4 = (Mvc_Cube_t *)&pCover_00->lCubes;
    }
    else {
      pMVar4 = (pCover_00->lCubes).pTail;
    }
    pMVar4->pNext = pMVar3;
    (pCover_00->lCubes).pTail = pMVar3;
    pMVar3->pNext = (Mvc_Cube_t *)0x0;
    piVar1 = &(pCover_00->lCubes).nItems;
    *piVar1 = *piVar1 + 1;
    return pCover_00;
  }
  __assert_fail("Mvc_CoverReadCubeNum(pSimple) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/mvc/mvcLits.c"
                ,0xee,"Mvc_Cover_t *Mvc_CoverBestLiteralCover(Mvc_Cover_t *, Mvc_Cover_t *)");
}

Assistant:

Mvc_Cover_t * Mvc_CoverBestLiteralCover( Mvc_Cover_t * pCover, Mvc_Cover_t * pSimple )
{
    Mvc_Cover_t * pCoverNew;
    Mvc_Cube_t * pCubeNew;
    Mvc_Cube_t * pCubeS;
    int iLitBest;

    // create the new cover
    pCoverNew = Mvc_CoverClone( pCover );
    // get the new cube
    pCubeNew = Mvc_CubeAlloc( pCoverNew );
    // clean the cube
    Mvc_CubeBitClean( pCubeNew );

    // get the first cube of pSimple
    assert( Mvc_CoverReadCubeNum(pSimple) == 1 );
    pCubeS = Mvc_CoverReadCubeHead( pSimple );
    // find the best literal among those of pCubeS
    iLitBest = Mvc_CoverBestLiteral( pCover, pCubeS );

    // insert this literal into the cube
    Mvc_CubeBitInsert( pCubeNew, iLitBest );
    // add the cube to the cover
    Mvc_CoverAddCubeTail( pCoverNew, pCubeNew );
    return pCoverNew;
}